

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

bool __thiscall CConnman::ForNode(CConnman *this,NodeId id,function<bool_(CNode_*)> *func)

{
  long lVar1;
  bool bVar2;
  reference ppCVar3;
  NodeId NVar4;
  undefined8 in_RDX;
  long in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  CNode **pnode;
  vector<CNode_*,_std::allocator<CNode_*>_> *__range1;
  CNode *found;
  iterator __end1;
  iterator __begin1;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock105;
  CNode *in_stack_ffffffffffffff68;
  function<bool_(CNode_*)> *in_stack_ffffffffffffff70;
  undefined5 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7d;
  undefined1 in_stack_ffffffffffffff7e;
  undefined1 in_stack_ffffffffffffff7f;
  byte bVar5;
  char *in_stack_ffffffffffffff98;
  AnnotatedMixin<std::recursive_mutex> *in_stack_ffffffffffffffa0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_stack_ffffffffffffffa8;
  CNode *local_48;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = (CNode *)0x0;
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffff68);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_RDI,
             (int)((ulong)in_RDX >> 0x20),SUB81((ulong)in_RDX >> 0x18,0));
  std::vector<CNode_*,_std::allocator<CNode_*>_>::begin
            ((vector<CNode_*,_std::allocator<CNode_*>_> *)in_stack_ffffffffffffff70);
  std::vector<CNode_*,_std::allocator<CNode_*>_>::end
            ((vector<CNode_*,_std::allocator<CNode_*>_> *)in_stack_ffffffffffffff70);
  do {
    bVar2 = __gnu_cxx::operator==<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>
                      ((__normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>
                        *)CONCAT17(in_stack_ffffffffffffff7f,
                                   CONCAT16(in_stack_ffffffffffffff7e,
                                            CONCAT15(in_stack_ffffffffffffff7d,
                                                     in_stack_ffffffffffffff78))),
                       (__normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>
                        *)in_stack_ffffffffffffff70);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
LAB_0022227e:
      bVar5 = false;
      if (local_48 != (CNode *)0x0) {
        bVar2 = NodeFullyConnected(in_stack_ffffffffffffff68);
        bVar5 = false;
        if (bVar2) {
          bVar5 = std::function<bool_(CNode_*)>::operator()
                            (in_stack_ffffffffffffff70,
                             (CNode *)(ulong)CONCAT16(in_stack_ffffffffffffff7e,
                                                      CONCAT15(in_stack_ffffffffffffff7d,
                                                               in_stack_ffffffffffffff78)));
        }
      }
      UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
                ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffff68);
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
        __stack_chk_fail();
      }
      return (bool)(bVar5 & 1);
    }
    ppCVar3 = __gnu_cxx::
              __normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>::
              operator*((__normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>
                         *)in_stack_ffffffffffffff68);
    NVar4 = CNode::GetId(in_stack_ffffffffffffff68);
    if (NVar4 == in_RSI) {
      local_48 = *ppCVar3;
      goto LAB_0022227e;
    }
    __gnu_cxx::__normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>::
    operator++((__normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_> *)
               in_stack_ffffffffffffff68);
  } while( true );
}

Assistant:

bool CConnman::ForNode(NodeId id, std::function<bool(CNode* pnode)> func)
{
    CNode* found = nullptr;
    LOCK(m_nodes_mutex);
    for (auto&& pnode : m_nodes) {
        if(pnode->GetId() == id) {
            found = pnode;
            break;
        }
    }
    return found != nullptr && NodeFullyConnected(found) && func(found);
}